

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

MapinfoEdMapItem * __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::Insert
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this,
          int key,MapinfoEdMapItem *value)

{
  undefined8 uVar1;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  
  pNVar5 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar6 = pNVar5, pNVar6 != (Node *)0x0 && (pNVar6->Next != (Node *)0x1))) {
    pNVar5 = pNVar6->Next;
    if ((pNVar6->Pair).Key == key) {
LAB_003865cf:
      if (pNVar6 == (Node *)0x0) {
        pNVar6 = NewKey(this,key);
        (pNVar6->Pair).Value.classname.Index = (value->classname).Index;
        *(undefined8 *)((pNVar6->Pair).Value.args + 3) = *(undefined8 *)(value->args + 3);
        cVar2 = value->argsdefined;
        uVar3 = value->field_0x7;
        iVar4 = value->args[0];
        uVar1 = *(undefined8 *)(value->args + 1);
        (pNVar6->Pair).Value.special = value->special;
        (pNVar6->Pair).Value.argsdefined = cVar2;
        (pNVar6->Pair).Value.field_0x7 = uVar3;
        (pNVar6->Pair).Value.args[0] = iVar4;
        *(undefined8 *)((pNVar6->Pair).Value.args + 1) = uVar1;
        FString::AttachToOther(&(pNVar6->Pair).Value.filename,&value->filename);
      }
      else {
        (pNVar6->Pair).Value.classname.Index = (value->classname).Index;
        cVar2 = value->argsdefined;
        uVar3 = value->field_0x7;
        iVar4 = value->args[0];
        uVar1 = *(undefined8 *)(value->args + 1);
        (pNVar6->Pair).Value.special = value->special;
        (pNVar6->Pair).Value.argsdefined = cVar2;
        (pNVar6->Pair).Value.field_0x7 = uVar3;
        (pNVar6->Pair).Value.args[0] = iVar4;
        *(undefined8 *)((pNVar6->Pair).Value.args + 1) = uVar1;
        *(undefined8 *)((pNVar6->Pair).Value.args + 3) = *(undefined8 *)(value->args + 3);
        FString::operator=(&(pNVar6->Pair).Value.filename,&value->filename);
      }
      (pNVar6->Pair).Value.linenum = value->linenum;
      return &(pNVar6->Pair).Value;
    }
  }
  pNVar6 = (Node *)0x0;
  goto LAB_003865cf;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}